

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::ReOpen(TPZFileEqnStorage<std::complex<float>_> *this)

{
  char *__filename;
  FILE *pFVar1;
  long in_RDI;
  int64_t sizereturn;
  
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"rb");
  *(FILE **)(in_RDI + 0xa0) = pFVar1;
  fread((void *)(in_RDI + 8),4,1,*(FILE **)(in_RDI + 0xa0));
  fread((void *)(in_RDI + 0xb0),4,1,*(FILE **)(in_RDI + 0xa0));
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::ReOpen()
{
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) LOGPZ_DEBUG(logger,"reopening the file")
#endif
	fIOStream = fopen(fFileName.c_str(),"rb"); //open for reading
	/**
	 *Opens binary files and get initial information
	 *use this information for storage requirements
	 */
	int64_t sizereturn;
	sizereturn = 0;
	sizereturn = fread(&fNumHeaders,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	sizereturn = fread(&fNumBlocks,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
}